

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.cpp
# Opt level: O3

int create_framebuffers(Init *init,RenderData *data)

{
  pointer ppVVar1;
  pointer ppVVar2;
  pointer ppVVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  VkResult VVar7;
  int iVar8;
  pointer ppVVar9;
  char *__function;
  long lVar10;
  ulong uVar11;
  VkImageView attachments [1];
  anon_union_24_2_293c120a_for_Result<std::vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>_>_1
  local_78;
  VkRenderPass pVStack_60;
  undefined8 local_58;
  VkImageView_T **ppVStack_50;
  VkExtent2D local_48;
  undefined8 uStack_40;
  VkImageView_T *local_38;
  
  vkb::Swapchain::get_images
            ((Result<std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>_> *)&local_78.m_value,
             &init->swapchain);
  uVar6 = local_78.m_value.super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage;
  uVar5 = local_78.m_value.super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>.
          _M_impl.super__Vector_impl_data._M_finish;
  uVar4 = local_78.m_value.super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>.
          _M_impl.super__Vector_impl_data._M_start;
  if ((byte)pVStack_60 == 0) {
    __function = 
    "T vkb::Result<std::vector<VkImage_T *>>::value() && [T = std::vector<VkImage_T *>]";
  }
  else {
    local_78.m_value.super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.m_value.super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.m_value.super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ppVVar1 = (data->swapchain_images).super__Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppVVar2 = (data->swapchain_images).super__Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (data->swapchain_images).super__Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)uVar4;
    (data->swapchain_images).super__Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)uVar5;
    (data->swapchain_images).super__Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)uVar6;
    if (ppVVar1 != (pointer)0x0) {
      operator_delete(ppVVar1,(long)ppVVar2 - (long)ppVVar1);
    }
    if ((((byte)pVStack_60 & 1) != 0) &&
       (local_78.m_value.super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
      operator_delete(local_78.m_value.
                      super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_78.m_value.
                            super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage - local_78._0_8_);
    }
    vkb::Swapchain::get_image_views
              ((Result<std::vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>_> *)
               &local_78.m_value,&init->swapchain);
    uVar6 = local_78.m_value.super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage;
    uVar5 = local_78.m_value.super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
    uVar4 = local_78.m_value.super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
    if ((byte)pVStack_60 != 0) {
      local_78.m_value.super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      local_78.m_value.super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)0x0;
      local_78.m_value.super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ppVVar9 = (data->swapchain_image_views).
                super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppVVar3 = (data->swapchain_image_views).
                super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
      (data->swapchain_image_views).
      super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)uVar4;
      (data->swapchain_image_views).
      super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)uVar5;
      (data->swapchain_image_views).
      super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)uVar6;
      if (ppVVar9 != (pointer)0x0) {
        operator_delete(ppVVar9,(long)ppVVar3 - (long)ppVVar9);
      }
      if ((((byte)pVStack_60 & 1) != 0) &&
         (local_78.m_value.super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
        operator_delete(local_78.m_value.
                        super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_78.m_value.
                              super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage - local_78._0_8_);
      }
      std::vector<VkFramebuffer_T_*,_std::allocator<VkFramebuffer_T_*>_>::resize
                (&data->framebuffers,
                 (long)(data->swapchain_image_views).
                       super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>._M_impl
                       .super__Vector_impl_data._M_finish -
                 (long)(data->swapchain_image_views).
                       super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>._M_impl
                       .super__Vector_impl_data._M_start >> 3);
      ppVVar9 = (data->swapchain_image_views).
                super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((data->swapchain_image_views).
          super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>._M_impl.
          super__Vector_impl_data._M_finish == ppVVar9) {
        iVar8 = 0;
      }
      else {
        lVar10 = 0;
        uVar11 = 0;
        do {
          local_38 = ppVVar9[uVar11];
          local_78.m_value.super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_78.m_value.super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_78.m_value.super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x25;
          pVStack_60 = data->render_pass;
          local_58 = 1;
          ppVStack_50 = &local_38;
          local_48 = (init->swapchain).extent;
          uStack_40 = 1;
          VVar7 = (*(init->disp).fp_vkCreateFramebuffer)
                            ((init->disp).device,(VkFramebufferCreateInfo *)&local_78.m_value,
                             (VkAllocationCallbacks *)0x0,
                             (VkFramebuffer *)
                             ((long)(data->framebuffers).
                                    super__Vector_base<VkFramebuffer_T_*,_std::allocator<VkFramebuffer_T_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar10));
          if (VVar7 != VK_SUCCESS) break;
          uVar11 = uVar11 + 1;
          ppVVar9 = (data->swapchain_image_views).
                    super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          lVar10 = lVar10 + 8;
        } while (uVar11 < (ulong)((long)(data->swapchain_image_views).
                                        super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar9
                                 >> 3));
        iVar8 = -(uint)(VVar7 != VK_SUCCESS);
      }
      return iVar8;
    }
    __function = 
    "T vkb::Result<std::vector<VkImageView_T *>>::value() && [T = std::vector<VkImageView_T *>]";
  }
  __assert_fail("m_init",
                "/workspace/llm4binary/github/license_c_cmakelists/charles-lunarg[P]vk-bootstrap/src/VkBootstrap.h"
                ,0x89,__function);
}

Assistant:

int create_framebuffers(Init& init, RenderData& data) {
    data.swapchain_images = init.swapchain.get_images().value();
    data.swapchain_image_views = init.swapchain.get_image_views().value();

    data.framebuffers.resize(data.swapchain_image_views.size());

    for (size_t i = 0; i < data.swapchain_image_views.size(); i++) {
        VkImageView attachments[] = { data.swapchain_image_views[i] };

        VkFramebufferCreateInfo framebuffer_info = {};
        framebuffer_info.sType = VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO;
        framebuffer_info.renderPass = data.render_pass;
        framebuffer_info.attachmentCount = 1;
        framebuffer_info.pAttachments = attachments;
        framebuffer_info.width = init.swapchain.extent.width;
        framebuffer_info.height = init.swapchain.extent.height;
        framebuffer_info.layers = 1;

        if (init.disp.createFramebuffer(&framebuffer_info, nullptr, &data.framebuffers[i]) != VK_SUCCESS) {
            return -1; // failed to create framebuffer
        }
    }
    return 0;
}